

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O0

err_t RenderDataFloat(ebml_float *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  uint local_60;
  float local_5c;
  uint32_t Buf_1;
  anon_union_4_2_947300a4 data_1;
  uint64_t Buf;
  anon_union_8_2_947300a4 data;
  size_t i;
  err_t Err;
  filepos_t *Rendered_local;
  bool_t bStack_28;
  int ForProfile_local;
  bool_t bWithDefault_local;
  bool_t bForceWithoutMandatory_local;
  stream *Output_local;
  ebml_float *Element_local;
  
  data.f = 0.0;
  Err = (err_t)Rendered;
  Rendered_local._4_4_ = ForProfile;
  bStack_28 = bWithDefault;
  bWithDefault_local = bForceWithoutMandatory;
  bForceWithoutMandatory_local = (bool_t)Output;
  Output_local = (stream *)Element;
  if ((Element->Base).DataSize == 8) {
    Buf = (uint64_t)Element->Value;
    _Buf_1 = Buf << 0x38 | (Buf >> 8 & 0xff) << 0x30 | (Buf >> 0x10 & 0xff) << 0x28 |
             (Buf >> 0x18 & 0xff) << 0x20 | (Buf >> 0x20 & 0xff) << 0x18 |
             (Buf >> 0x28 & 0xff) << 0x10 | (Buf >> 0x30 & 0xff) << 8 | Buf >> 0x38;
    if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xb0,
                    "err_t RenderDataFloat(ebml_float *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    i = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,&Buf_1,8,&data);
  }
  else {
    local_5c = (float)Element->Value;
    local_60 = (int)local_5c << 0x18 | ((uint)local_5c >> 8 & 0xff) << 0x10 |
               ((uint)local_5c >> 0x10 & 0xff) << 8 | (uint)local_5c >> 0x18;
    if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xbb,
                    "err_t RenderDataFloat(ebml_float *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    i = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,&local_60,4,&data);
  }
  if (Err != 0) {
    *(anon_union_8_2_947300a4 *)Err = data;
  }
  return i;
}

Assistant:

static err_t RenderDataFloat(ebml_float *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    err_t Err;
    size_t i = 0;
    if (Element->Base.DataSize == 8)
    {
        union {
            uint32_t i;
            double f;
        } data;
        uint64_t Buf;
        data.f = Element->Value;
        Buf = LOAD64BE(&data.i);
        Err = Stream_Write(Output,&Buf,8,&i);
    }
    else
    {
        union {
            uint32_t i;
            float f;
        } data;
        uint32_t Buf;
        data.f = (float)Element->Value;
        Buf = LOAD32BE(&data.i);
        Err = Stream_Write(Output,&Buf,4,&i);
    }
    if (Rendered)
        *Rendered = i;
    return Err;
}